

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

date_t duckdb::DatePart::PartOperator<duckdb::LastDayOperator>::
       Operation<duckdb::date_t,duckdb::date_t>
                 (date_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  date_t dVar2;
  
  bVar1 = Value::IsFinite<duckdb::date_t>(input);
  if (bVar1) {
    dVar2 = LastDayOperator::Operation<duckdb::date_t,duckdb::date_t>(input);
    return (date_t)dVar2.days;
  }
  TemplatedValidityMask<unsigned_long>::SetInvalid
            (&mask->super_TemplatedValidityMask<unsigned_long>,idx);
  return (date_t)0;
}

Assistant:

static inline TR Operation(TA input, ValidityMask &mask, idx_t idx, void *dataptr) {
			if (Value::IsFinite(input)) {
				return OP::template Operation<TA, TR>(input);
			} else {
				mask.SetInvalid(idx);
				return TR();
			}
		}